

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O0

UBool icu_63::PropNameData::containsName(BytesTrie *trie,char *name)

{
  byte bVar1;
  char *pcVar2;
  UStringTrieResult local_24;
  char c;
  char *pcStack_20;
  UStringTrieResult result;
  char *name_local;
  BytesTrie *trie_local;
  
  if (name == (char *)0x0) {
    trie_local._7_1_ = false;
  }
  else {
    local_24 = USTRINGTRIE_NO_VALUE;
    pcStack_20 = name;
    while( true ) {
      pcVar2 = pcStack_20 + 1;
      if (*pcStack_20 == '\0') break;
      bVar1 = uprv_asciitolower_63(*pcStack_20);
      pcStack_20 = pcVar2;
      if ((((bVar1 != 0x2d) && (bVar1 != 0x5f)) && (bVar1 != 0x20)) &&
         (((char)bVar1 < '\t' || ('\r' < (char)bVar1)))) {
        if ((local_24 & USTRINGTRIE_NO_VALUE) == USTRINGTRIE_NO_MATCH) {
          return '\0';
        }
        local_24 = BytesTrie::next(trie,(uint)bVar1);
      }
    }
    trie_local._7_1_ = 1 < (int)local_24;
  }
  return trie_local._7_1_;
}

Assistant:

UBool PropNameData::containsName(BytesTrie &trie, const char *name) {
    if(name==NULL) {
        return FALSE;
    }
    UStringTrieResult result=USTRINGTRIE_NO_VALUE;
    char c;
    while((c=*name++)!=0) {
        c=uprv_invCharToLowercaseAscii(c);
        // Ignore delimiters '-', '_', and ASCII White_Space.
        if(c==0x2d || c==0x5f || c==0x20 || (0x09<=c && c<=0x0d)) {
            continue;
        }
        if(!USTRINGTRIE_HAS_NEXT(result)) {
            return FALSE;
        }
        result=trie.next((uint8_t)c);
    }
    return USTRINGTRIE_HAS_VALUE(result);
}